

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O1

Vec_Str_t * Fra_SmlSimulateReadFile(char *pFileName)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  FILE *__stream;
  Vec_Str_t *__ptr;
  char *pcVar4;
  size_t __size;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    __ptr = (Vec_Str_t *)0x0;
    printf("Cannot open file \"%s\" with simulation patterns.\n",pFileName);
  }
  else {
    __ptr = (Vec_Str_t *)malloc(0x10);
    __ptr->nCap = 1000;
    __ptr->nSize = 0;
    pcVar4 = (char *)malloc(1000);
    __ptr->pArray = pcVar4;
    uVar3 = fgetc(__stream);
    while (uVar3 != 0xffffffff) {
      if ((uVar3 & 0xfffffffe) == 0x30) {
        uVar1 = __ptr->nSize;
        uVar2 = __ptr->nCap;
        if (uVar1 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (__ptr->pArray == (char *)0x0) {
              pcVar4 = (char *)malloc(0x10);
            }
            else {
              pcVar4 = (char *)realloc(__ptr->pArray,0x10);
            }
            __size = 0x10;
          }
          else {
            __size = (ulong)uVar2 * 2;
            if ((int)__size <= (int)uVar2) goto LAB_00698773;
            if (__ptr->pArray == (char *)0x0) {
              pcVar4 = (char *)malloc(__size);
            }
            else {
              pcVar4 = (char *)realloc(__ptr->pArray,__size);
            }
          }
          __ptr->pArray = pcVar4;
          __ptr->nCap = (int)__size;
        }
LAB_00698773:
        __ptr->nSize = uVar1 + 1;
        __ptr->pArray[(int)uVar1] = (char)uVar3 + -0x30;
      }
      else if ((0x20 < uVar3) || ((0x100002600U >> ((ulong)uVar3 & 0x3f) & 1) == 0)) {
        printf("File \"%s\" contains symbol (%c) other than \'0\' or \'1\'.\n",pFileName,
               (ulong)(uint)(int)(char)uVar3);
        if (__ptr->pArray != (char *)0x0) {
          free(__ptr->pArray);
          __ptr->pArray = (char *)0x0;
        }
        free(__ptr);
        __ptr = (Vec_Str_t *)0x0;
        break;
      }
      uVar3 = fgetc(__stream);
    }
    fclose(__stream);
  }
  return __ptr;
}

Assistant:

Vec_Str_t * Fra_SmlSimulateReadFile( char * pFileName )
{
    Vec_Str_t * vRes;
    FILE * pFile;
    int c;
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" with simulation patterns.\n", pFileName );
        return NULL;
    }
    vRes = Vec_StrAlloc( 1000 );
    while ( (c = fgetc(pFile)) != EOF )
    {
        if ( c == '0' || c == '1' )
            Vec_StrPush( vRes, (char)(c - '0') );
        else if ( c != ' ' && c != '\r' && c != '\n' && c != '\t' )
        {
            printf( "File \"%s\" contains symbol (%c) other than \'0\' or \'1\'.\n", pFileName, (char)c );
            Vec_StrFreeP( &vRes );
            break;
        }
    }
    fclose( pFile );
    return vRes;
}